

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg_demo.cpp
# Opt level: O2

void __thiscall despot::RegDemo::Init(RegDemo *this,istream *is)

{
  int *piVar1;
  vector<double,_std::allocator<double>_> *this_00;
  vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
  *this_01;
  uint uVar2;
  pointer pdVar3;
  pointer pvVar4;
  long lVar5;
  vector<despot::State,_std::allocator<despot::State>_> *this_02;
  int iVar6;
  int iVar7;
  istream *piVar8;
  RegDemoState *pRVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  double dVar15;
  State local_70 [32];
  string tok;
  
  tok._M_dataplus._M_p = (pointer)&tok.field_2;
  tok._M_string_length = 0;
  tok.field_2._M_local_buf[0] = '\0';
  piVar8 = std::operator>>(is,(string *)&tok);
  piVar8 = std::operator>>(piVar8,(string *)&tok);
  piVar1 = &this->size_;
  std::istream::operator>>((istream *)piVar8,piVar1);
  std::vector<despot::RegDemoState_*,_std::allocator<despot::RegDemoState_*>_>::resize
            (&this->states_,(long)this->size_ + 1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->obs_,(long)this->size_ + 1);
  this_00 = &this->trap_prob_;
  std::vector<double,_std::allocator<double>_>::resize(this_00,(long)this->size_ + 1);
  iVar6 = this->size_;
  lVar13 = 0;
  for (uVar12 = 0; (long)uVar12 < (long)iVar6; uVar12 = uVar12 + 1) {
    pRVar9 = (RegDemoState *)operator_new(0x20);
    RegDemoState::RegDemoState(pRVar9,(int)uVar12);
    *(RegDemoState **)
     ((long)(this->states_).
            super__Vector_base<despot::RegDemoState_*,_std::allocator<despot::RegDemoState_*>_>.
            _M_impl.super__Vector_impl_data._M_start + lVar13) = pRVar9;
    *(ulong *)((long)(this->obs_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start + lVar13) = (ulong)(uVar12 == 2);
    std::istream::_M_extract<double>((double *)is);
    iVar6 = *piVar1;
    if (uVar12 == iVar6 - 1) {
      pdVar3 = (this->trap_prob_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      this->goal_reward_ = *(double *)((long)pdVar3 + lVar13);
      *(undefined8 *)((long)pdVar3 + lVar13) = 0;
    }
    lVar13 = lVar13 + 8;
  }
  pRVar9 = (RegDemoState *)operator_new(0x20);
  RegDemoState::RegDemoState(pRVar9,iVar6);
  iVar6 = this->size_;
  (this->states_).
  super__Vector_base<despot::RegDemoState_*,_std::allocator<despot::RegDemoState_*>_>._M_impl.
  super__Vector_impl_data._M_start[iVar6] = pRVar9;
  (this->obs_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[iVar6] = 2;
  (this->trap_prob_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start[iVar6] = 1.0;
  this_01 = &this->transition_probabilities_;
  std::
  vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
  ::resize(this_01,(long)(this->states_).
                         super__Vector_base<despot::RegDemoState_*,_std::allocator<despot::RegDemoState_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->states_).
                         super__Vector_base<despot::RegDemoState_*,_std::allocator<despot::RegDemoState_*>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3);
  uVar12 = 0;
  do {
    uVar10 = uVar12;
    if ((ulong)((long)(this->states_).
                      super__Vector_base<despot::RegDemoState_*,_std::allocator<despot::RegDemoState_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->states_).
                      super__Vector_base<despot::RegDemoState_*,_std::allocator<despot::RegDemoState_*>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar10) {
      std::__cxx11::string::~string((string *)&tok);
      return;
    }
    pvVar4 = (this->transition_probabilities_).
             super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar6 = (**(code **)(*(long *)this + 0x28))(this);
    std::
    vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
    ::resize(pvVar4 + uVar10,(long)iVar6);
    iVar6 = (int)uVar10;
    lVar13 = 0;
    for (lVar14 = 0; iVar7 = (**(code **)(*(long *)this + 0x28))(this), uVar12 = uVar10 + 1,
        lVar14 < iVar7; lVar14 = lVar14 + 1) {
      uVar2 = *piVar1;
      if (uVar10 == uVar2) {
        lVar5 = *(long *)&(this_01->
                          super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start[uVar10].
                          super__Vector_base<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                          ._M_impl.super__Vector_impl_data;
        despot::State::State(local_70,iVar6,1.0);
        std::vector<despot::State,_std::allocator<despot::State>_>::emplace_back<despot::State>
                  ((vector<despot::State,_std::allocator<despot::State>_> *)(lVar5 + lVar13),
                   local_70);
LAB_00108b84:
        despot::State::~State(local_70);
      }
      else {
        iVar7 = iVar6 + 1;
        if (((int)lVar14 == 2) || (iVar7 = iVar6, (int)lVar14 != 0)) {
          if (lVar14 == 1) {
            iVar7 = iVar6 + -1;
          }
          if (iVar7 < 1) {
            iVar7 = 0;
          }
          iVar11 = uVar2 - 1;
          if (iVar7 < (int)uVar2) {
            iVar11 = iVar7;
          }
          dVar15 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[iVar11];
          if (dVar15 < 1.0) {
            lVar5 = *(long *)&(this_01->
                              super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[uVar10].
                              super__Vector_base<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                              ._M_impl.super__Vector_impl_data;
            despot::State::State(local_70,iVar11,1.0 - dVar15);
            std::vector<despot::State,_std::allocator<despot::State>_>::emplace_back<despot::State>
                      ((vector<despot::State,_std::allocator<despot::State>_> *)(lVar5 + lVar13),
                       local_70);
            despot::State::~State(local_70);
            dVar15 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start[iVar11];
          }
          if (0.0 < dVar15) {
            lVar5 = *(long *)&(this_01->
                              super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[uVar10].
                              super__Vector_base<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                              ._M_impl.super__Vector_impl_data;
            despot::State::State(local_70,*piVar1,dVar15);
            std::vector<despot::State,_std::allocator<despot::State>_>::emplace_back<despot::State>
                      ((vector<despot::State,_std::allocator<despot::State>_> *)(lVar5 + lVar13),
                       local_70);
            goto LAB_00108b84;
          }
        }
        else if (uVar10 != uVar2 - 1) {
          this_02 = (this_01->
                    super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start[uVar10].
                    super__Vector_base<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          despot::State::State(local_70,iVar6,1.0);
          std::vector<despot::State,_std::allocator<despot::State>_>::emplace_back<despot::State>
                    (this_02,local_70);
          goto LAB_00108b84;
        }
      }
      lVar13 = lVar13 + 0x18;
    }
  } while( true );
}

Assistant:

void RegDemo::Init(istream& is) {
	string tok;
	is >> tok >> tok >> size_;
	states_.resize(size_ + 1);
	obs_.resize(size_ + 1);
	trap_prob_.resize(size_ + 1);
	for (int x = 0; x < size_; x++) {
		states_[x] = new RegDemoState(x);
		obs_[x] = (x == 2 ? 1 : 0);

		is >> trap_prob_[x];

		if (x == size_ - 1) {
			goal_reward_ = trap_prob_[x];
			trap_prob_[x] = 0;
		}
	}
	states_[size_] = new RegDemoState(size_); // Trapped
	obs_[size_] = 2;
	trap_prob_[size_] = 1.0; // No way to escape

	// Build transition matrix
	transition_probabilities_.resize(states_.size());
	for (int s = 0; s < states_.size(); s++) {
		transition_probabilities_[s].resize(NumActions());

		for (int a = 0; a < NumActions(); a++) {
			if (s == size_) {
				transition_probabilities_[s][a].push_back(State(s, 1.0));
			} else if (a == A_STAY) {
				if (s != size_ - 1) // Not a terminal state
					transition_probabilities_[s][a].push_back(State(s, 1.0));
			} else {
				int next = s;
				if (a == A_RIGHT)
					next = s + 1;
				if (a == A_LEFT)
					next = s - 1;

				if (next < 0)
					next = 0;
				if (next >= size_)
					next = size_ - 1;

				if (trap_prob_[next] < 1.0)
					transition_probabilities_[s][a].push_back(
						State(next, 1 - trap_prob_[next]));
				if (trap_prob_[next] > 0.0)
					transition_probabilities_[s][a].push_back(
						State(size_, trap_prob_[next]));
			}
		}
	}
}